

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPoints.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderPointsVerification::verifyCorrectAmountOfDuplicateVertices
          (TessellationShaderPointsVerification *this,_run *run,void *run_data,uint run_n_vertices)

{
  float *pfVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  TestError *this_01;
  void *pvVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  float fVar4;
  char *local_200 [3];
  MessageBuilder local_1e8;
  undefined1 local_68 [8];
  string vertex_spacing;
  float *vertex_b;
  uint n_vertex_b;
  float *vertex_a;
  uint n_vertex_a;
  uint n_duplicate_vertices;
  float epsilon;
  uint run_n_vertices_local;
  void *run_data_local;
  _run *run_local;
  TessellationShaderPointsVerification *this_local;
  
  vertex_a._4_4_ = 0;
  pvVar3 = run_data;
  for (vertex_a._0_4_ = 0; (uint)vertex_a < run_n_vertices; vertex_a._0_4_ = (uint)vertex_a + 1) {
    pfVar1 = (float *)((long)run_data + (ulong)((uint)vertex_a * 3) * 4);
    vertex_b._4_4_ = (uint)vertex_a;
    while (vertex_b._4_4_ = vertex_b._4_4_ + 1, vertex_b._4_4_ < run_n_vertices) {
      vertex_spacing.field_2._8_8_ = (long)run_data + (ulong)(vertex_b._4_4_ * 3) * 4;
      fVar4 = de::abs<float>(*pfVar1 - *(float *)vertex_spacing.field_2._8_8_);
      pvVar3 = extraout_RDX;
      if (((fVar4 < 1e-05) &&
          (fVar4 = de::abs<float>(pfVar1[1] - *(float *)(vertex_spacing.field_2._8_8_ + 4)),
          pvVar3 = extraout_RDX_00, fVar4 < 1e-05)) &&
         (fVar4 = de::abs<float>(pfVar1[2] - *(float *)(vertex_spacing.field_2._8_8_ + 8)),
         pvVar3 = extraout_RDX_01, fVar4 < 1e-05)) {
        vertex_a._4_4_ = vertex_a._4_4_ + 1;
      }
    }
  }
  if (vertex_a._4_4_ == 0) {
    return;
  }
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            ((string *)local_68,(TessellationShaderUtils *)(ulong)run->vertex_spacing,
             (_tessellation_shader_vertex_spacing)pvVar3);
  this_00 = tcu::TestContext::getLog
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1e8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1e8,
                      (char (*) [93])
                      "Duplicate vertices found for the following tesselelation configuration: tessellation level:["
                     );
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->inner);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->inner + 1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [31])"], outer tessellation level: [");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer + 1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer + 2);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [3])0x2a3caab);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,run->outer + 3);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [4])0x2b6cfd0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [22])"vertex spacing mode:[");
  local_200[0] = (char *)std::__cxx11::string::c_str();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_200);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x29dc08e);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1e8);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Duplicate vertex found",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPoints.cpp"
             ,0x419);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void TessellationShaderPointsVerification::verifyCorrectAmountOfDuplicateVertices(const _run& run, const void* run_data,
																				  unsigned int run_n_vertices)
{
	const float  epsilon			  = 1e-5f;
	unsigned int n_duplicate_vertices = 0;

	for (unsigned int n_vertex_a = 0; n_vertex_a < run_n_vertices; ++n_vertex_a)
	{
		const float* vertex_a = (const float*)run_data + n_vertex_a * 3; /* components */

		for (unsigned int n_vertex_b = n_vertex_a + 1; n_vertex_b < run_n_vertices; ++n_vertex_b)
		{
			const float* vertex_b = (const float*)run_data + n_vertex_b * 3; /* components */

			if (de::abs(vertex_a[0] - vertex_b[0]) < epsilon && de::abs(vertex_a[1] - vertex_b[1]) < epsilon &&
				de::abs(vertex_a[2] - vertex_b[2]) < epsilon)
			{
				n_duplicate_vertices++;
			}
		} /* for (all vertices) */
	}	 /* for (all vertices) */

	if (n_duplicate_vertices != 0)
	{
		std::string vertex_spacing = TessellationShaderUtils::getESTokenForVertexSpacingMode(run.vertex_spacing);

		m_testCtx.getLog() << tcu::TestLog::Message << "Duplicate vertices found for the following tesselelation"
													   " configuration: tessellation level:"
													   "["
						   << run.inner[0] << ", " << run.inner[1] << "], "
																	  "outer tessellation level:"
																	  " ["
						   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", " << run.outer[3]
						   << "], "
						   << "vertex spacing mode:[" << vertex_spacing.c_str() << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Duplicate vertex found");
	}
}